

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t get_time_t_max(void)

{
  time_t a;
  
  if (get_time_t_max::t == 0) {
    a = 1;
    while (get_time_t_max::t < a) {
      get_time_t_max::t = a;
      a = a * 2 + 1;
    }
  }
  return get_time_t_max::t;
}

Assistant:

static int64_t
get_time_t_max(void)
{
#if defined(TIME_T_MAX)
	return TIME_T_MAX;
#else
	static time_t t;
	time_t a;
	if (t == 0) {
		a = 1;
		while (a > t) {
			t = a;
			a = a * 2 + 1;
		}
	}
	return t;
#endif
}